

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall
QComboBox::insertItem(QComboBox *this,int index,QIcon *icon,QString *text,QVariant *userData)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QComboBoxPrivate *pQVar4;
  int *piVar5;
  QStandardItemModel *pQVar6;
  QStandardItem *this_00;
  ulong uVar7;
  QString *in_RCX;
  undefined8 in_R8;
  long in_FS_OFFSET;
  QStandardItem *item;
  QStandardItemModel *m;
  QComboBoxPrivate *d;
  QMap<int,_QVariant> values;
  QModelIndex item_1;
  int itemCount;
  QVariant *in_stack_fffffffffffffe30;
  QAbstractItemModel *pQVar8;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  QComboBox *in_stack_fffffffffffffe40;
  QComboBoxPrivate *parent;
  QComboBoxPrivate *in_stack_fffffffffffffe48;
  QPersistentModelIndex local_128 [3];
  QPersistentModelIndex local_110 [3];
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined1 *local_e8;
  QPersistentModelIndex local_e0 [3];
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  QPersistentModelIndex local_b0 [3];
  undefined4 local_94;
  int local_90;
  int local_8c;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QComboBox *)0x539525);
  local_90 = count(in_stack_fffffffffffffe40);
  local_94 = 0;
  piVar5 = qBound<int>((int *)in_stack_fffffffffffffe40,
                       (int *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       (int *)in_stack_fffffffffffffe30);
  local_8c = *piVar5;
  if (local_8c < pQVar4->maxCount) {
    pQVar6 = qobject_cast<QStandardItemModel*>((QObject *)0x53959f);
    iVar2 = local_8c;
    if (pQVar6 == (QStandardItemModel *)0x0) {
      pQVar4->field_0x34c = pQVar4->field_0x34c & 0xf7 | 8;
      pQVar8 = pQVar4->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_b0);
      uVar7 = (**(code **)(*(long *)pQVar8 + 0xf8))(pQVar8,iVar2,1,local_b0);
      iVar2 = local_8c;
      if ((uVar7 & 1) == 0) {
        pQVar4->field_0x34c = pQVar4->field_0x34c & 0xf7;
      }
      else {
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        local_c0 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar8 = pQVar4->model;
        iVar3 = pQVar4->modelColumn;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_e0);
        (**(code **)(*(long *)pQVar8 + 0x60))(&local_c8,pQVar8,iVar2,iVar3,local_e0);
        uVar7 = QIcon::isNull();
        if (((uVar7 & 1) == 0) || (bVar1 = ::QVariant::isValid(in_stack_fffffffffffffe30), bVar1)) {
          local_e8 = &DAT_aaaaaaaaaaaaaaaa;
          QMap<int,_QVariant>::QMap((QMap<int,_QVariant> *)0x539846);
          bVar1 = QString::isNull((QString *)0x539853);
          if (!bVar1) {
            local_ec = 2;
            ::QVariant::QVariant(&local_68,in_RCX);
            QMap<int,_QVariant>::insert
                      ((QMap<int,_QVariant> *)in_stack_fffffffffffffe40,
                       (int *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       in_stack_fffffffffffffe30);
            ::QVariant::~QVariant(&local_68);
          }
          uVar7 = QIcon::isNull();
          if ((uVar7 & 1) == 0) {
            local_f0 = 1;
            QIcon::operator_cast_to_QVariant((QIcon *)&local_88);
            QMap<int,_QVariant>::insert
                      ((QMap<int,_QVariant> *)in_stack_fffffffffffffe40,
                       (int *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       in_stack_fffffffffffffe30);
            ::QVariant::~QVariant(&local_88);
          }
          bVar1 = ::QVariant::isValid(in_stack_fffffffffffffe30);
          if (bVar1) {
            local_f4 = 0x100;
            QMap<int,_QVariant>::insert
                      ((QMap<int,_QVariant> *)in_stack_fffffffffffffe40,
                       (int *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       in_stack_fffffffffffffe30);
          }
          bVar1 = QMap<int,_QVariant>::isEmpty((QMap<int,_QVariant> *)in_stack_fffffffffffffe30);
          if (!bVar1) {
            (**(code **)(*(long *)pQVar4->model + 0xb8))(pQVar4->model,&local_c8,&local_e8);
          }
          QMap<int,_QVariant>::~QMap((QMap<int,_QVariant> *)0x53998c);
        }
        else {
          in_stack_fffffffffffffe48 = (QComboBoxPrivate *)pQVar4->model;
          ::QVariant::QVariant(&local_48,in_RCX);
          (**(code **)(*(long *)&in_stack_fffffffffffffe48->super_QWidgetPrivate + 0x98))
                    (in_stack_fffffffffffffe48,&local_c8,&local_48,2);
          ::QVariant::~QVariant(&local_48);
        }
        pQVar4->field_0x34c = pQVar4->field_0x34c & 0xf7;
        parent = pQVar4;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_110);
        QComboBoxPrivate::rowsInserted
                  (in_stack_fffffffffffffe48,(QModelIndex *)parent,in_stack_fffffffffffffe3c,
                   in_stack_fffffffffffffe38);
        local_90 = local_90 + 1;
      }
    }
    else {
      this_00 = (QStandardItem *)operator_new(0x10);
      iVar2 = (int)((ulong)in_stack_fffffffffffffe40 >> 0x20);
      QStandardItem::QStandardItem(this_00,in_RCX);
      uVar7 = QIcon::isNull();
      if ((uVar7 & 1) == 0) {
        QIcon::operator_cast_to_QVariant((QIcon *)&local_28);
        (**(code **)(*(long *)this_00 + 0x20))(this_00,&local_28,1);
        ::QVariant::~QVariant(&local_28);
      }
      bVar1 = ::QVariant::isValid(in_stack_fffffffffffffe30);
      if (bVar1) {
        (**(code **)(*(long *)this_00 + 0x20))(this_00,in_R8,0x100);
      }
      QStandardItemModel::insertRow
                ((QStandardItemModel *)in_stack_fffffffffffffe48,iVar2,
                 (QStandardItem *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      local_90 = local_90 + 1;
    }
    if (pQVar4->maxCount < local_90) {
      pQVar8 = pQVar4->model;
      iVar2 = local_90 + -1;
      iVar3 = local_90 - pQVar4->maxCount;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_128);
      (**(code **)(*(long *)pQVar8 + 0x108))(pQVar8,iVar2,iVar3,local_128);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBox::insertItem(int index, const QIcon &icon, const QString &text, const QVariant &userData)
{
    Q_D(QComboBox);
    int itemCount = count();
    index = qBound(0, index, itemCount);
    if (index >= d->maxCount)
        return;

    // For the common case where we are using the built in QStandardItemModel
    // construct a QStandardItem, reducing the number of expensive signals from the model
    if (QStandardItemModel *m = qobject_cast<QStandardItemModel*>(d->model)) {
        QStandardItem *item = new QStandardItem(text);
        if (!icon.isNull()) item->setData(icon, Qt::DecorationRole);
        if (userData.isValid()) item->setData(userData, Qt::UserRole);
        m->insertRow(index, item);
        ++itemCount;
    } else {
        d->inserting = true;
        if (d->model->insertRows(index, 1, d->root)) {
            QModelIndex item = d->model->index(index, d->modelColumn, d->root);
            if (icon.isNull() && !userData.isValid()) {
                d->model->setData(item, text, Qt::EditRole);
            } else {
                QMap<int, QVariant> values;
                if (!text.isNull()) values.insert(Qt::EditRole, text);
                if (!icon.isNull()) values.insert(Qt::DecorationRole, icon);
                if (userData.isValid()) values.insert(Qt::UserRole, userData);
                if (!values.isEmpty()) d->model->setItemData(item, values);
            }
            d->inserting = false;
            d->rowsInserted(d->root, index, index);
            ++itemCount;
        } else {
            d->inserting = false;
        }
    }

    if (itemCount > d->maxCount)
        d->model->removeRows(itemCount - 1, itemCount - d->maxCount, d->root);
}